

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O2

void testDeepScanLineBasic(string *tempDir)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined4 *puVar4;
  bool bVar5;
  Header h;
  undefined8 local_48 [6];
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "\n\nTesting the DeepScanLineInput/OutputFile for basic use:\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  random_reseed(1);
  IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::numThreads();
  iVar1 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar1);
  local_48[0] = 0;
  Imf_3_2::Header::Header(&h,0x40,0x40,1.0,(Vec2 *)local_48,1.0,INCREASING_Y,ZIP_COMPRESSION);
  Imf_3_2::Header::setType((string *)&h);
  pcVar3 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)local_48,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar3,(Channel *)"Dummy");
  puVar4 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar4 = 0;
  bVar5 = SUB81(&h,0);
  Imf_3_2::Header::sanityCheck(bVar5,false);
  puVar4 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar4 = 2;
  Imf_3_2::Header::sanityCheck(bVar5,false);
  puVar4 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar4 = 1;
  Imf_3_2::Header::sanityCheck(bVar5,false);
  std::operator<<((ostream *)&std::cout,"accepted valid compression types\n");
  puVar4 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar4 = 3;
  Imf_3_2::Header::sanityCheck(bVar5,false);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                ,0x24b,"void (anonymous namespace)::testCompressionTypeChecks()");
}

Assistant:

void
testDeepScanLineBasic (const std::string& tempDir)
{
    try
    {
        cout << "\n\nTesting the DeepScanLineInput/OutputFile for basic use:\n"
             << endl;

        random_reseed (1);

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (4);

        testCompressionTypeChecks ();

        const Box2i largeDataWindow (
            V2i (large::minX, large::minY),
            V2i (
                large::minX + large::width - 1,
                large::minY + large::height - 1));
        const Box2i largeDisplayWindow (
            V2i (0, 0),
            V2i (
                large::minX + large::width * 2,
                large::minY + large::height * 2));

        readWriteTest (tempDir, 1, 3, largeDataWindow, largeDisplayWindow);

        const Box2i dataWindow (
            V2i (small::minX, small::minY),
            V2i (
                small::minX + small::width - 1,
                small::minY + small::height - 1));
        const Box2i displayWindow (
            V2i (0, 0),
            V2i (
                small::minX + small::width * 2,
                small::minY + small::height * 2));

        readWriteTest (tempDir, 1, 50, dataWindow, displayWindow);
        readWriteTest (tempDir, 3, 25, dataWindow, displayWindow);
        readWriteTest (tempDir, 10, 10, dataWindow, displayWindow);

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}